

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O3

void pcp_fill_sockaddr(sockaddr *dst,in6_addr *sip,uint16_t sport,int ret_ipv6_mapped_ipv4,
                      uint32_t scope_id)

{
  undefined8 uVar1;
  
  if ((((ret_ipv6_mapped_ipv4 == 0) && ((sip->__in6_u).__u6_addr32[0] == 0)) &&
      ((sip->__in6_u).__u6_addr32[1] == 0)) && ((sip->__in6_u).__u6_addr32[2] == 0xffff0000)) {
    dst->sa_family = 2;
    *(uint32_t *)(dst->sa_data + 2) = (sip->__in6_u).__u6_addr32[3];
    *(uint16_t *)dst->sa_data = sport;
    return;
  }
  dst->sa_family = 10;
  uVar1 = *(undefined8 *)((long)&sip->__in6_u + 8);
  *(undefined8 *)(dst->sa_data + 6) = *(undefined8 *)&sip->__in6_u;
  dst[1].sa_family = (short)uVar1;
  dst[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
  dst[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
  dst[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
  dst[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
  dst[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
  dst[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
  *(uint16_t *)dst->sa_data = sport;
  *(uint32_t *)(dst[1].sa_data + 6) = scope_id;
  return;
}

Assistant:

void pcp_fill_sockaddr(struct sockaddr *dst, struct in6_addr *sip,
                       uint16_t sport, int ret_ipv6_mapped_ipv4,
                       uint32_t scope_id) {
    if ((!ret_ipv6_mapped_ipv4) && (IN6_IS_ADDR_V4MAPPED(sip))) {
        struct sockaddr_in *s = (struct sockaddr_in *)dst;

        s->sin_family = AF_INET;
        s->sin_addr.s_addr = S6_ADDR32(sip)[3];
        s->sin_port = sport;
        SET_SA_LEN(s, sizeof(struct sockaddr_in));
    } else {
        struct sockaddr_in6 *s = (struct sockaddr_in6 *)dst;

        s->sin6_family = AF_INET6;
        s->sin6_addr = *sip;
        s->sin6_port = sport;
        s->sin6_scope_id = scope_id;
        SET_SA_LEN(s, sizeof(struct sockaddr_in6));
    }
}